

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1_util.cpp
# Opt level: O0

bool cfd::core::CheckTweakAddXonlyPubkey
               (SchnorrPubkey *tweaked_pubkey,SchnorrPubkey *base_pubkey,ByteData256 *tweak,
               bool parity)

{
  pointer ctx_00;
  uint tweaked_pk_parity_00;
  int iVar1;
  uchar *tweaked_pubkey32;
  uchar *tweak32;
  bool bVar2;
  int ret;
  int tweaked_pk_parity;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tweak_bytes;
  secp256k1_xonly_pubkey base_xonly_key;
  ByteData local_60;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> tweak_xonly_key;
  secp256k1_context_struct *ctx;
  bool parity_local;
  ByteData256 *tweak_local;
  SchnorrPubkey *base_pubkey_local;
  SchnorrPubkey *tweaked_pubkey_local;
  
  tweak_xonly_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)wally_get_secp_context();
  SchnorrPubkey::GetData(&local_60,tweaked_pubkey);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,&local_60);
  ByteData::~ByteData((ByteData *)0x49bb36);
  ParseXOnlyPubkey((secp256k1_xonly_pubkey *)
                   ((long)&tweak_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 4),base_pubkey);
  ByteData256::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,tweak);
  ctx_00 = tweak_xonly_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
  tweaked_pk_parity_00 = parity & 1;
  tweaked_pubkey32 =
       ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x49bb7b);
  tweak32 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x49bb9a);
  iVar1 = secp256k1_xonly_pubkey_tweak_add_check
                    ((secp256k1_context *)ctx_00,tweaked_pubkey32,tweaked_pk_parity_00,
                     (secp256k1_xonly_pubkey *)
                     ((long)&tweak_bytes.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4),tweak32);
  bVar2 = iVar1 == 1;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(iVar1,tweaked_pk_parity_00));
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(iVar1,tweaked_pk_parity_00));
  return bVar2;
}

Assistant:

bool CheckTweakAddXonlyPubkey(
    const SchnorrPubkey& tweaked_pubkey, const SchnorrPubkey& base_pubkey,
    const ByteData256& tweak, bool parity) {
  auto ctx = wally_get_secp_context();
  std::vector<uint8_t> tweak_xonly_key = tweaked_pubkey.GetData().GetBytes();
  auto base_xonly_key = ParseXOnlyPubkey(base_pubkey);
  std::vector<uint8_t> tweak_bytes = tweak.GetBytes();
  int tweaked_pk_parity = (parity) ? 1 : 0;

  int ret = secp256k1_xonly_pubkey_tweak_add_check(
      ctx, tweak_xonly_key.data(), tweaked_pk_parity, &base_xonly_key,
      tweak_bytes.data());

  return (ret == 1);
}